

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O0

Curl_tree * Curl_splay(timeval i,Curl_tree *t)

{
  long *plVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  long comp;
  Curl_tree *y;
  Curl_tree *r;
  Curl_tree *l;
  Curl_tree N;
  Curl_tree *t_local;
  timeval i_local;
  
  lVar3 = i.tv_usec;
  lVar4 = i.tv_sec;
  i_local.tv_usec = (__suseconds_t)t;
  if (t != (Curl_tree *)0x0) {
    N.smaller = (Curl_tree *)0x0;
    l = (Curl_tree *)0x0;
    y = (Curl_tree *)&l;
    r = (Curl_tree *)&l;
    N.payload = t;
    while( true ) {
      while( true ) {
        if (lVar4 < *(long *)((long)N.payload + 0x18)) {
          local_7c = 0xffffffff;
        }
        else {
          if (*(long *)((long)N.payload + 0x18) < lVar4) {
            local_80 = 1;
          }
          else {
            if (lVar3 < *(long *)((long)N.payload + 0x20)) {
              local_84 = 0xffffffff;
            }
            else {
              local_84 = (uint)(*(long *)((long)N.payload + 0x20) < lVar3);
            }
            local_80 = local_84;
          }
          local_7c = local_80;
        }
        if (-1 < (int)local_7c) break;
        if (*N.payload == 0) goto LAB_00111389;
        if (lVar4 < *(long *)(*N.payload + 0x18)) {
          local_88 = 0xffffffff;
        }
        else {
          if (*(long *)(*N.payload + 0x18) < lVar4) {
            local_8c = 1;
          }
          else {
            if (lVar3 < *(long *)(*N.payload + 0x20)) {
              local_90 = 0xffffffff;
            }
            else {
              local_90 = (uint)(*(long *)(*N.payload + 0x20) < lVar3);
            }
            local_8c = local_90;
          }
          local_88 = local_8c;
        }
        if ((int)local_88 < 0) {
          plVar1 = *N.payload;
          *(long *)N.payload = plVar1[1];
          plVar1[1] = (long)N.payload;
          N.payload = plVar1;
          if (*plVar1 == 0) goto LAB_00111389;
        }
        y->smaller = (Curl_tree *)N.payload;
        y = (Curl_tree *)N.payload;
        N.payload = *N.payload;
      }
      if (((int)local_7c < 1) || (*(long *)((long)N.payload + 8) == 0)) break;
      if (lVar4 < *(long *)(*(long *)((long)N.payload + 8) + 0x18)) {
        local_94 = 0xffffffff;
      }
      else {
        if (*(long *)(*(long *)((long)N.payload + 8) + 0x18) < lVar4) {
          local_98 = 1;
        }
        else {
          if (lVar3 < *(long *)(*(long *)((long)N.payload + 8) + 0x20)) {
            local_9c = 0xffffffff;
          }
          else {
            local_9c = (uint)(*(long *)(*(long *)((long)N.payload + 8) + 0x20) < lVar3);
          }
          local_98 = local_9c;
        }
        local_94 = local_98;
      }
      if (0 < (int)local_94) {
        puVar2 = *(undefined8 **)((long)N.payload + 8);
        *(undefined8 *)((long)N.payload + 8) = *puVar2;
        *puVar2 = N.payload;
        N.payload = puVar2;
        if (puVar2[1] == 0) break;
      }
      r->larger = (Curl_tree *)N.payload;
      r = (Curl_tree *)N.payload;
      N.payload = *(void **)((long)N.payload + 8);
    }
LAB_00111389:
    r->larger = *N.payload;
    y->smaller = *(Curl_tree **)((long)N.payload + 8);
    *(Curl_tree **)N.payload = N.smaller;
    *(Curl_tree **)((long)N.payload + 8) = l;
    i_local.tv_usec = (__suseconds_t)N.payload;
  }
  return (Curl_tree *)i_local.tv_usec;
}

Assistant:

struct Curl_tree *Curl_splay(struct timeval i,
                             struct Curl_tree *t)
{
  struct Curl_tree N, *l, *r, *y;
  long comp;

  if(t == NULL)
    return t;
  N.smaller = N.larger = NULL;
  l = r = &N;

  for(;;) {
    comp = compare(i, t->key);
    if(comp < 0) {
      if(t->smaller == NULL)
        break;
      if(compare(i, t->smaller->key) < 0) {
        y = t->smaller;                           /* rotate smaller */
        t->smaller = y->larger;
        y->larger = t;
        t = y;
        if(t->smaller == NULL)
          break;
      }
      r->smaller = t;                               /* link smaller */
      r = t;
      t = t->smaller;
    }
    else if(comp > 0) {
      if(t->larger == NULL)
        break;
      if(compare(i, t->larger->key) > 0) {
        y = t->larger;                          /* rotate larger */
        t->larger = y->smaller;
        y->smaller = t;
        t = y;
        if(t->larger == NULL)
          break;
      }
      l->larger = t;                              /* link larger */
      l = t;
      t = t->larger;
    }
    else
      break;
  }

  l->larger = t->smaller;                                /* assemble */
  r->smaller = t->larger;
  t->smaller = N.larger;
  t->larger = N.smaller;

  return t;
}